

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O1

Dim * __thiscall
cnn::DotProduct::dim_forward
          (Dim *__return_storage_ptr__,DotProduct *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  ulong uVar1;
  pointer pDVar2;
  long lVar3;
  uint uVar4;
  ostream *poVar5;
  invalid_argument *this_00;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  pDVar2 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar2 != 0x48) goto LAB_0021e6b8;
  uVar6 = (ulong)pDVar2->nd;
  if (1 < uVar6) {
    if (pDVar2->d[1] != 1) goto LAB_0021e6b8;
    uVar7 = 1;
    do {
      if ((2 - uVar6) + uVar7 == 1) goto LAB_0021e65e;
      uVar1 = uVar7 + 1;
      lVar3 = uVar7 + 1;
      uVar7 = uVar1;
    } while (pDVar2->d[lVar3] == 1);
    if (uVar1 < uVar6) goto LAB_0021e6b8;
  }
LAB_0021e65e:
  uVar6 = (ulong)pDVar2[1].nd;
  if (1 < uVar6) {
    if (pDVar2[1].d[1] != 1) goto LAB_0021e6b8;
    lVar3 = 0;
    do {
      lVar8 = lVar3;
      if (uVar6 - 2 == lVar8) goto LAB_0021e68e;
      lVar3 = lVar8 + 1;
    } while (pDVar2[1].d[lVar8 + 2] == 1);
    if (lVar8 + 2U < uVar6) goto LAB_0021e6b8;
  }
LAB_0021e68e:
  if (pDVar2->d[0] == pDVar2[1].d[0]) {
    uVar4 = pDVar2[1].bd;
    if (pDVar2[1].bd < pDVar2->bd) {
      uVar4 = pDVar2->bd;
    }
    __return_storage_ptr__->bd = uVar4;
    __return_storage_ptr__->nd = 1;
    __return_storage_ptr__->d[0] = 1;
    return __return_storage_ptr__;
  }
LAB_0021e6b8:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Bad arguments to DotProduct: ",0x1d);
  poVar5 = operator<<((ostream *)&std::cerr,xs);
  std::endl<char,std::char_traits<char>>(poVar5);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Bad arguments to DotProduct");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim DotProduct::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2 ||
      !LooksLikeVector(xs[0]) ||
      !LooksLikeVector(xs[1]) ||
      xs[0].rows() != xs[1].rows()) {
    cerr << "Bad arguments to DotProduct: " << xs << endl;
    throw std::invalid_argument("Bad arguments to DotProduct");
  }
  return Dim({1}, max(xs[0].bd, xs[1].bd));
}